

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_sprkstep_io.c
# Opt level: O2

int sprkStep_GetNumRhsEvals(ARKodeMem ark_mem,int partition_index,long *rhs_evals)

{
  int iVar1;
  long lVar2;
  char *msgfmt;
  ARKodeSPRKStepMem step_mem;
  
  step_mem = (ARKodeSPRKStepMem)0x0;
  iVar1 = sprkStep_AccessStepMem(ark_mem,"sprkStep_GetNumRhsEvals",&step_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (rhs_evals == (long *)0x0) {
    msgfmt = "rhs_evals is NULL";
    iVar1 = 0xac;
  }
  else {
    if (partition_index < 2) {
      if (partition_index == 1) {
        lVar2 = step_mem->nf2;
      }
      else {
        if (partition_index != 0) {
          *rhs_evals = step_mem->nf2 + step_mem->nf1;
          return 0;
        }
        lVar2 = step_mem->nf1;
      }
      *rhs_evals = lVar2;
      return 0;
    }
    msgfmt = "Invalid partition index";
    iVar1 = 0xb3;
  }
  arkProcessError(ark_mem,-0x16,iVar1,"sprkStep_GetNumRhsEvals",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_sprkstep_io.c"
                  ,msgfmt);
  return -0x16;
}

Assistant:

int sprkStep_GetNumRhsEvals(ARKodeMem ark_mem, int partition_index,
                            long int* rhs_evals)
{
  ARKodeSPRKStepMem step_mem = NULL;

  /* access ARKodeSPRKStepMem structure */
  int retval = sprkStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  if (rhs_evals == NULL)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "rhs_evals is NULL");
    return ARK_ILL_INPUT;
  }

  if (partition_index > 1)
  {
    arkProcessError(ark_mem, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Invalid partition index");
    return ARK_ILL_INPUT;
  }

  switch (partition_index)
  {
  case 0: *rhs_evals = step_mem->nf1; break;
  case 1: *rhs_evals = step_mem->nf2; break;
  default: *rhs_evals = step_mem->nf1 + step_mem->nf2; break;
  }

  return ARK_SUCCESS;
}